

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffmvec(fitsfile *fptr,int colnum,LONGLONG newveclen,int *status)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  int *in_RDI;
  tcolumn *colptr;
  char tcode [2];
  char keyname [75];
  char tfm [71];
  long nblock;
  LONGLONG repeat;
  LONGLONG delbyte;
  LONGLONG width;
  LONGLONG freespace;
  LONGLONG firstcol;
  LONGLONG naxis2;
  LONGLONG naxis1;
  LONGLONG ndelete;
  LONGLONG nadd;
  LONGLONG nbytes;
  LONGLONG firstbyte;
  LONGLONG size;
  LONGLONG datasize;
  int tstatus;
  int tfields;
  int datacode;
  int *in_stack_000009f8;
  long in_stack_00000a00;
  fitsfile *in_stack_00000a08;
  int *in_stack_000015c0;
  int in_stack_000015cc;
  long in_stack_000015d0;
  fitsfile *in_stack_000015d8;
  int *in_stack_000025e0;
  LONGLONG in_stack_000025e8;
  LONGLONG in_stack_000025f0;
  LONGLONG in_stack_000025f8;
  LONGLONG in_stack_00002600;
  fitsfile *in_stack_00002608;
  int *in_stack_00018558;
  LONGLONG in_stack_00018560;
  LONGLONG in_stack_00018568;
  LONGLONG in_stack_00018570;
  fitsfile *in_stack_00018578;
  char local_14a [10];
  int *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  int *in_stack_ffffffffffffff00;
  int *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff14;
  fitsfile *in_stack_ffffffffffffff18;
  long local_98;
  long local_90;
  int *status_00;
  char *comm;
  long in_stack_ffffffffffffff98;
  int *in_stack_ffffffffffffffa0;
  fitsfile *in_stack_ffffffffffffffa8;
  int local_4;
  
  if (*in_RCX < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
         (iVar1 = ffrdef(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0), 0 < iVar1)) {
        return *in_RCX;
      }
    }
    else {
      ffmahd(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff00);
    }
    if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 2) {
      if ((in_ESI < 1) || (*(int *)(*(long *)(in_RDI + 2) + 0x3b0) < in_ESI)) {
        *in_RCX = 0x12e;
        local_4 = 0x12e;
      }
      else {
        lVar3 = *(long *)(*(long *)(in_RDI + 2) + 0x3d0) + (long)(in_ESI + -1) * 0xa0;
        iVar1 = *(int *)(lVar3 + 0x50);
        lVar4 = *(long *)(lVar3 + 0x58);
        local_90 = *(long *)(lVar3 + 0x98);
        if (iVar1 < 0) {
          ffpmsg((char *)0x12b336);
          *in_RCX = 0x105;
          local_4 = 0x105;
        }
        else if (lVar4 == in_RDX) {
          local_4 = *in_RCX;
        }
        else {
          if (iVar1 == 0x10) {
            local_90 = 1;
          }
          comm = *(char **)(*(long *)(in_RDI + 2) + 0x3c8);
          status_00 = *(int **)(*(long *)(in_RDI + 2) + 0x3c0);
          local_98 = (in_RDX - lVar4) * local_90;
          if (iVar1 == 1) {
            local_98 = (in_RDX + 7) / 8 - (lVar4 + 7) / 8;
          }
          if (local_98 < 1) {
            if (local_98 < 0) {
              lVar4 = *(long *)(*(long *)(in_RDI + 2) + 0x3d8) +
                      *(long *)(*(long *)(in_RDI + 2) + 0x3e0);
              lVar3 = local_98 * (long)status_00;
              ffcdel(in_stack_00002608,in_stack_00002600,in_stack_000025f8,in_stack_000025f0,
                     in_stack_000025e8,in_stack_000025e0);
              in_stack_ffffffffffffff98 = local_98 * (long)status_00;
              if (0 < *(long *)(*(long *)(in_RDI + 2) + 0x3e0)) {
                in_stack_ffffffffffffffa8 = *(fitsfile **)(*(long *)(in_RDI + 2) + 0x3e0);
                iVar2 = ffshft(in_stack_00018578,in_stack_00018570,in_stack_00018568,
                               in_stack_00018560,in_stack_00018558);
                if (0 < iVar2) {
                  return *in_RCX;
                }
              }
              if (0 < ((((lVar4 + 0xb3f) / 0xb40) * 0xb40 - lVar4) - lVar3) / 0xb40) {
                ffdblk(in_stack_00000a08,in_stack_00000a00,in_stack_000009f8);
              }
              *(long *)(*(long *)(in_RDI + 2) + 0x3d8) =
                   in_stack_ffffffffffffff98 + *(long *)(*(long *)(in_RDI + 2) + 0x3d8);
              ffmkyj(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98,comm,status_00);
            }
          }
          else {
            lVar4 = *(long *)(*(long *)(in_RDI + 2) + 0x3d8) +
                    *(long *)(*(long *)(in_RDI + 2) + 0x3e0);
            in_stack_ffffffffffffffa0 = (int *)(local_98 * (long)status_00);
            if (((((lVar4 + 0xb3f) / 0xb40) * 0xb40 - lVar4) - (long)in_stack_ffffffffffffffa0 < 0)
               && (iVar2 = ffiblk(in_stack_000015d8,in_stack_000015d0,in_stack_000015cc,
                                  in_stack_000015c0), 0 < iVar2)) {
              return *in_RCX;
            }
            if (0 < *(long *)(*(long *)(in_RDI + 2) + 0x3e0)) {
              in_stack_ffffffffffffffa8 = *(fitsfile **)(*(long *)(in_RDI + 2) + 0x3e0);
              iVar2 = ffshft(in_stack_00018578,in_stack_00018570,in_stack_00018568,in_stack_00018560
                             ,in_stack_00018558);
              if (0 < iVar2) {
                return *in_RCX;
              }
            }
            *(long *)(*(long *)(in_RDI + 2) + 0x3d8) =
                 (long)in_stack_ffffffffffffffa0 + *(long *)(*(long *)(in_RDI + 2) + 0x3d8);
            ffmkyj(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98,comm,status_00);
            ffcins(in_stack_00002608,in_stack_00002600,in_stack_000025f8,in_stack_000025f0,
                   in_stack_000025e8,in_stack_000025e0);
          }
          if (iVar1 == 1) {
            strcpy(local_14a,"X");
          }
          else if (iVar1 == 0xb) {
            strcpy(local_14a,"B");
          }
          else if (iVar1 == 0xe) {
            strcpy(local_14a,"L");
          }
          else if (iVar1 == 0x10) {
            strcpy(local_14a,"A");
          }
          else if (iVar1 == 0x15) {
            strcpy(local_14a,"I");
          }
          else if (iVar1 == 0x29) {
            strcpy(local_14a,"J");
          }
          else if (iVar1 == 0x51) {
            strcpy(local_14a,"K");
          }
          else if (iVar1 == 0x2a) {
            strcpy(local_14a,"E");
          }
          else if (iVar1 == 0x52) {
            strcpy(local_14a,"D");
          }
          else if (iVar1 == 0x53) {
            strcpy(local_14a,"C");
          }
          else if (iVar1 == 0xa3) {
            strcpy(local_14a,"M");
          }
          snprintf(&stack0xffffffffffffff08,0x47,"%.0f%s",(double)in_RDX,local_14a);
          ffkeyn(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8,
                 in_stack_fffffffffffffec0);
          ffmkys((fitsfile *)keyname._56_8_,(char *)keyname._48_8_,(char *)keyname._40_8_,
                 (char *)keyname._32_8_,(int *)keyname._24_8_);
          ffmkyj(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98,comm,status_00);
          ffrdef(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
          local_4 = *in_RCX;
        }
      }
    }
    else {
      ffpmsg((char *)0x12b244);
      *in_RCX = 0xeb;
      local_4 = 0xeb;
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffmvec(fitsfile *fptr,  /* I - FITS file pointer                        */
           int colnum,      /* I - position of col to be modified           */
           LONGLONG newveclen,  /* I - new vector length of column (TFORM)       */
           int *status)     /* IO - error status                            */
/*
  Modify the vector length of a column in a binary table, larger or smaller.
  E.g., change a column from TFORMn = '1E' to '20E'.
*/
{
    int datacode, tfields, tstatus;
    LONGLONG datasize, size, firstbyte, nbytes, nadd, ndelete;
    LONGLONG naxis1, naxis2, firstcol, freespace;
    LONGLONG width, delbyte, repeat;
    long nblock;
    char tfm[FLEN_VALUE], keyname[FLEN_KEYWORD], tcode[2];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
        /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype != BINARY_TBL)
    {
       ffpmsg(
  "Can only change vector length of a column in BINTABLE extension (ffmvec)");
       return(*status = NOT_TABLE);
    }

    /*  is the column number valid?  */
    tfields = (fptr->Fptr)->tfield;
    if (colnum < 1 || colnum > tfields)
        return(*status = BAD_COL_NUM);

    /* look up the current vector length and element width */

    colptr = (fptr->Fptr)->tableptr;
    colptr += (colnum - 1);

    datacode = colptr->tdatatype; /* datatype of the column */
    repeat =  colptr->trepeat;  /* field repeat count  */
    width =  colptr->twidth;   /*  width of a single element in chars */

    if (datacode < 0)
    {
        ffpmsg(
        "Can't modify vector length of variable length column (ffmvec)");
        return(*status = BAD_TFORM);
    }

    if (repeat == newveclen)
        return(*status);  /* column already has the desired vector length */

    if (datacode == TSTRING)
        width = 1;      /* width was equal to width of unit string */

    naxis1 =  (fptr->Fptr)->rowlength;   /* current width of the table */
    naxis2 = (fptr->Fptr)->numrows;

    delbyte = (newveclen - repeat) * width;    /* no. of bytes to insert */
    if (datacode == TBIT)  /* BIT column is a special case */
       delbyte = ((newveclen + 7) / 8) - ((repeat + 7) / 8);

    if (delbyte > 0)  /* insert space for more elements */
    {
      /* current size of data */
      datasize = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;
      freespace = ( ( (datasize + 2879) / 2880) * 2880) - datasize;

      nadd = (LONGLONG)delbyte * naxis2;   /* no. of bytes to add to table */

      if ( (freespace - nadd) < 0)   /* not enough existing space? */
      {
        nblock = (long) ((nadd - freespace + 2879) / 2880);    /* number of blocks  */
        if (ffiblk(fptr, nblock, 1, status) > 0)      /* insert the blocks */
          return(*status);
      }

      /* shift heap down (if it exists) */
      if ((fptr->Fptr)->heapsize > 0)
      {
        nbytes = (fptr->Fptr)->heapsize;    /* no. of bytes to shift down */

        /* absolute heap pos */
        firstbyte = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart;

        if (ffshft(fptr, firstbyte, nbytes, nadd, status) > 0) /* move heap */
            return(*status);
      }

      /* update the heap starting address */
      (fptr->Fptr)->heapstart += nadd;

      /* update the THEAP keyword if it exists */
      tstatus = 0;
      ffmkyj(fptr, "THEAP", (fptr->Fptr)->heapstart, "&", &tstatus);

      /* Must reset colptr before using it again.  (fptr->Fptr)->tableptr
         may have been reallocated down in ffbinit via the call to ffiblk above.*/
      colptr = (fptr->Fptr)->tableptr;
      colptr += (colnum - 1);

      firstcol = colptr->tbcol + (repeat * width);  /* insert position */

      /* insert delbyte bytes in every row, at byte position firstcol */
      ffcins(fptr, naxis1, naxis2, delbyte, firstcol, status);
    }
    else if (delbyte < 0)
    {
      /* current size of table */
      size = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;
      freespace = ((size + 2879) / 2880) * 2880 - size - ((LONGLONG)delbyte * naxis2);
      nblock = (long) (freespace / 2880);   /* number of empty blocks to delete */
      firstcol = colptr->tbcol + (newveclen * width);  /* delete position */

      /* delete elements from the vector */
      ffcdel(fptr, naxis1, naxis2, -delbyte, firstcol, status);
 
      /* abs heap pos */
      firstbyte = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart;
      ndelete = (LONGLONG)delbyte * naxis2; /* size of shift (negative) */

      /* shift heap up (if it exists) */
      if ((fptr->Fptr)->heapsize > 0)
      {
        nbytes = (fptr->Fptr)->heapsize;    /* no. of bytes to shift up */
        if (ffshft(fptr, firstbyte, nbytes, ndelete, status) > 0)
          return(*status);
      }

      /* delete the empty  blocks at the end of the HDU */
      if (nblock > 0)
        ffdblk(fptr, nblock, status);

      /* update the heap starting address */
      (fptr->Fptr)->heapstart += ndelete;  /* ndelete is negative */

      /* update the THEAP keyword if it exists */
      tstatus = 0;
      ffmkyj(fptr, "THEAP", (fptr->Fptr)->heapstart, "&", &tstatus);
    }

    /* construct the new TFORM keyword for the column */
    if (datacode == TBIT)
      strcpy(tcode,"X");
    else if (datacode == TBYTE)
      strcpy(tcode,"B");
    else if (datacode == TLOGICAL)
      strcpy(tcode,"L");
    else if (datacode == TSTRING)
      strcpy(tcode,"A");
    else if (datacode == TSHORT)
      strcpy(tcode,"I");
    else if (datacode == TLONG)
      strcpy(tcode,"J");
    else if (datacode == TLONGLONG)
      strcpy(tcode,"K");
    else if (datacode == TFLOAT)
      strcpy(tcode,"E");
    else if (datacode == TDOUBLE)
      strcpy(tcode,"D");
    else if (datacode == TCOMPLEX)
      strcpy(tcode,"C");
    else if (datacode == TDBLCOMPLEX)
      strcpy(tcode,"M");

    /* write as a double value because the LONGLONG conversion */
    /* character in snprintf is platform dependent ( %lld, %ld, %I64d ) */

    snprintf(tfm,FLEN_VALUE,"%.0f%s",(double) newveclen, tcode); 

    ffkeyn("TFORM", colnum, keyname, status);  /* Keyword name */
    ffmkys(fptr, keyname, tfm, "&", status);   /* modify TFORM keyword */

    ffmkyj(fptr, "NAXIS1", naxis1 + delbyte, "&", status); /* modify NAXIS1 */

    ffrdef(fptr, status); /* reinitialize the new table structure */
    return(*status);
}